

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

void __thiscall
kratos::FSMState::output(FSMState *this,shared_ptr<kratos::Var> *output_var,int64_t value)

{
  int64_t output_var_00;
  uint32_t width;
  element_type *peVar1;
  bool *pbVar2;
  enable_shared_from_this<kratos::Var> local_38;
  Const *local_28;
  Const *c;
  int64_t value_local;
  shared_ptr<kratos::Var> *output_var_local;
  FSMState *this_local;
  
  c = (Const *)value;
  value_local = (int64_t)output_var;
  output_var_local = (shared_ptr<kratos::Var> *)this;
  peVar1 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      output_var);
  width = (*(peVar1->super_IRNode)._vptr_IRNode[7])();
  peVar1 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      value_local);
  pbVar2 = Var::is_signed(peVar1);
  local_28 = constant(value,width,(bool)(*pbVar2 & 1));
  output_var_00 = value_local;
  std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_38);
  output(this,(shared_ptr<kratos::Var> *)output_var_00,(shared_ptr<kratos::Var> *)&local_38);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_38);
  return;
}

Assistant:

void FSMState::output(const std::shared_ptr<Var>& output_var, int64_t value) {
    auto& c = constant(value, output_var->width(), output_var->is_signed());
    output(output_var, c.shared_from_this());
}